

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# direct_access.c
# Opt level: O2

ecs_column_t * da_get_or_create_column(ecs_world_t *world,ecs_table_t *table,int32_t column)

{
  ecs_column_t *peVar1;
  ecs_data_t *result;
  
  peVar1 = da_get_column(table,column);
  if (peVar1 == (ecs_column_t *)0x0) {
    if ((table->data == (ecs_data_t *)0x0) || (table->data->columns == (ecs_column_t *)0x0)) {
      result = ecs_table_get_or_create_data(table);
      ecs_init_data(world,table,result);
      peVar1 = da_get_column(table,column);
    }
    else {
      peVar1 = (ecs_column_t *)0x0;
    }
  }
  _ecs_assert(peVar1 != (ecs_column_t *)0x0,0xc,(char *)0x0,"c != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/addons/direct_access.c"
              ,0x24);
  if (peVar1 != (ecs_column_t *)0x0) {
    return peVar1;
  }
  __assert_fail("c != ((void*)0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/addons/direct_access.c"
                ,0x24,"ecs_column_t *da_get_or_create_column(ecs_world_t *, ecs_table_t *, int32_t)"
               );
}

Assistant:

static
ecs_column_t *da_get_or_create_column(
    ecs_world_t *world,
    ecs_table_t *table,
    int32_t column)
{
    ecs_column_t *c = da_get_column(table, column);
    if (!c && (!table->data || !table->data->columns)) {
        ecs_data_t *data = ecs_table_get_or_create_data(table);
        ecs_init_data(world, table, data);
        c = da_get_column(table, column);
    }
    ecs_assert(c != NULL, ECS_INTERNAL_ERROR, NULL);
    return c;
}